

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O2

uint * __thiscall FModelVertexBuffer::LockIndexBuffer(FModelVertexBuffer *this,uint size)

{
  uint *puVar1;
  
  if (this->ibo_id == 0) {
    return (uint *)0x0;
  }
  (*_ptrc_glBindBuffer)(0x8893,this->ibo_id);
  (*_ptrc_glBufferData)(0x8893,(ulong)size << 2,(void *)0x0,0x88e4);
  if (gl.legacyMode != false) {
    puVar1 = (uint *)(*_ptrc_glMapBuffer)(0x8893,0x88b9);
    return puVar1;
  }
  puVar1 = (uint *)(*_ptrc_glMapBufferRange)(0x8893,0,(ulong)size << 2,10);
  return puVar1;
}

Assistant:

unsigned int *FModelVertexBuffer::LockIndexBuffer(unsigned int size)
{
	if (ibo_id != 0)
	{
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ibo_id);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, size * sizeof(unsigned int), NULL, GL_STATIC_DRAW);
		if (!gl.legacyMode)
			return (unsigned int*)glMapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, size * sizeof(unsigned int), GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT);
		else
			return (unsigned int*)glMapBuffer(GL_ELEMENT_ARRAY_BUFFER, GL_WRITE_ONLY);
	}
	else
	{
		return nullptr;
	}
}